

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this,
          CommonArgProperties<Catch::ConfigData> *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  IArgFunction<Catch::ConfigData> *pIVar2;
  
  pIVar2 = (param_1->boundField).functionObj;
  if (pIVar2 == (IArgFunction<Catch::ConfigData> *)0x0) {
    pIVar2 = (IArgFunction<Catch::ConfigData> *)0x0;
  }
  else {
    iVar1 = (*pIVar2->_vptr_IArgFunction[4])();
    pIVar2 = (IArgFunction<Catch::ConfigData> *)CONCAT44(extraout_var,iVar1);
  }
  (this->boundField).functionObj = pIVar2;
  std::__cxx11::string::string((string *)&this->description,(string *)&param_1->description);
  std::__cxx11::string::string((string *)&this->detail,(string *)&param_1->detail);
  std::__cxx11::string::string((string *)&this->placeholder,(string *)&param_1->placeholder);
  return;
}

Assistant:

CommonArgProperties() {}